

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_replace(anm_archive_t *anm,FILE *anmfp,char *name,char *filename)

{
  ushort uVar1;
  ushort uVar2;
  long *plVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  image_t *__ptr;
  uchar *__ptr_00;
  long lVar12;
  long lVar13;
  format_t format;
  long lVar14;
  int iVar15;
  uint uVar16;
  list_node_t *plVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint height;
  uint width;
  
  width = 0;
  height = 0;
  util_total_entry_size(anm,name,&width,&height);
  uVar5 = width;
  uVar4 = height;
  uVar19 = (ulong)width;
  uVar20 = (ulong)height;
  if (height == 0 || width == 0) {
    return;
  }
  __ptr = png_read(filename);
  if ((uVar5 == __ptr->width) && (uVar4 == __ptr->height)) {
    lVar13 = 0;
    do {
      plVar17 = (anm->entries).head;
      if (plVar17 != (list_node_t *)0x0) {
        lVar18 = 0;
        do {
          plVar3 = (long *)plVar17->data;
          if ((char *)plVar3[2] == name) {
            format = (format_t)*(ushort *)(plVar3[1] + 6);
            if (((&DAT_0012f070)[lVar13] == format) && (*(short *)(*plVar3 + 0x34) != 0)) {
              __ptr_00 = format_from_rgba((uint32_t *)__ptr->data,uVar4 * uVar5,
                                          (uint)*(ushort *)(plVar3[1] + 6));
              lVar14 = *plVar3;
              lVar12 = plVar3[1];
              uVar8 = *(uint *)(lVar14 + 0x24);
              uVar16 = *(ushort *)(lVar12 + 10) + uVar8;
              if (anmfp == (FILE *)0x0) {
                if (uVar8 < uVar16) {
                  iVar15 = uVar5 * uVar8;
                  uVar16 = uVar8;
                  do {
                    lVar14 = plVar3[8];
                    uVar1 = *(ushort *)(lVar12 + 8);
                    uVar9 = format_Bpp(format);
                    uVar6 = format_Bpp(format);
                    iVar7 = *(int *)(*plVar3 + 0x20);
                    uVar10 = format_Bpp(format);
                    uVar2 = *(ushort *)(plVar3[1] + 8);
                    uVar11 = format_Bpp(format);
                    memcpy((void *)((ulong)((uVar16 - uVar8) * uVar9 * (uint)uVar1) + lVar14),
                           __ptr_00 + (ulong)(uVar10 * iVar7) + (ulong)(uVar6 * iVar15),
                           (ulong)(uVar2 * uVar11));
                    uVar16 = uVar16 + 1;
                    lVar12 = plVar3[1];
                    uVar8 = *(uint *)(*plVar3 + 0x24);
                    iVar15 = iVar15 + uVar5;
                  } while (uVar16 < *(ushort *)(lVar12 + 10) + uVar8);
                }
              }
              else if (uVar8 < uVar16) {
                iVar15 = uVar5 * uVar8;
                uVar16 = uVar8;
                do {
                  uVar9 = *(uint *)(lVar14 + 0x30);
                  uVar1 = *(ushort *)(lVar12 + 8);
                  uVar6 = format_Bpp(format);
                  iVar7 = file_seek(anmfp,(ulong)((uVar16 - uVar8) * uVar6 * (uint)uVar1) +
                                          (ulong)uVar9 + lVar18 + 0x10);
                  if (iVar7 == 0) goto LAB_00108166;
                  uVar8 = format_Bpp(format);
                  iVar7 = *(int *)(*plVar3 + 0x20);
                  uVar9 = format_Bpp(format);
                  uVar1 = *(ushort *)(plVar3[1] + 8);
                  uVar6 = format_Bpp(format);
                  iVar7 = file_write(anmfp,__ptr_00 +
                                           (ulong)(uVar9 * iVar7) + (ulong)(uVar8 * iVar15),
                                     (ulong)(uVar1 * uVar6));
                  if (iVar7 == 0) goto LAB_00108166;
                  uVar16 = uVar16 + 1;
                  lVar14 = *plVar3;
                  lVar12 = plVar3[1];
                  uVar8 = *(uint *)(lVar14 + 0x24);
                  iVar15 = iVar15 + uVar5;
                } while (uVar16 < *(ushort *)(lVar12 + 10) + uVar8);
              }
              free(__ptr_00);
            }
          }
          lVar18 = lVar18 + (ulong)*(uint *)(*plVar3 + 0x38);
          plVar17 = plVar17->next;
        } while (plVar17 != (list_node_t *)0x0);
      }
      lVar13 = lVar13 + 1;
      if (lVar13 == 5) {
        free(__ptr->data);
        free(__ptr);
        return;
      }
    } while( true );
  }
  fprintf(_stderr,"%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",argv0,
          current_input,name,filename,(ulong)__ptr->width,(ulong)__ptr->height,uVar19,uVar20);
LAB_00108166:
  exit(1);
}

Assistant:

static void
anm_replace(
    const anm_archive_t* anm,
    FILE* anmfp,
    const char* name,
    const char* filename)
{
    const format_t formats[] = {
        FORMAT_RGBA8888,
        FORMAT_BGRA8888,
        FORMAT_RGB565,
        FORMAT_ARGB4444,
        FORMAT_GRAY8
    };
    unsigned int f;
    unsigned int width = 0;
    unsigned int height = 0;
    image_t* image;

    util_total_entry_size(anm, name, &width, &height);
    if (width == 0 || height == 0) {
        /* There's nothing to do. */
        return;
    }

    image = png_read(filename);

    if (width != image->width || height != image->height) {
        fprintf(stderr,
            "%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",
            argv0, current_input, name, filename, image->width, image->height,
            width, height);
        exit(1);
    }

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {

        long offset = 0;
        anm_entry_t* entry;
        list_for_each(&anm->entries, entry) {
            if (entry->name == name &&
                entry->thtx->format == formats[f] &&
                entry->header->hasdata) {
                unsigned int y;

                unsigned char* converted_data = format_from_rgba((uint32_t*)image->data, width * height, formats[f]);

                if (anmfp) {
                    for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                        if (!file_seek(anmfp,
                            offset + entry->header->thtxoffset + sizeof(thtx_header_t) + (y - entry->header->y) * entry->thtx->w * format_Bpp(formats[f])))
                            exit(1);
                        if (!file_write(anmfp, converted_data + y * width * format_Bpp(formats[f]) + entry->header->x * format_Bpp(formats[f]), entry->thtx->w * format_Bpp(formats[f])))
                            exit(1);
                    }
                } else {
                    for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                        memcpy(entry->data + (y - entry->header->y) * entry->thtx->w * format_Bpp(formats[f]),
                               converted_data + y * width * format_Bpp(formats[f]) + entry->header->x * format_Bpp(formats[f]),
                               entry->thtx->w * format_Bpp(formats[f]));
                    }
                }

                free(converted_data);
            }

            offset += entry->header->nextoffset;
        }
    }

    free(image->data);
    free(image);
}